

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O2

void Io_WriteVerilogInt(FILE *pFile,Abc_Ntk_t *pNtk,int fOnlyAnds)

{
  long *plVar1;
  Abc_Ntk_t *pNtk_00;
  Mio_Gate_t *pGate;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  size_t sVar6;
  Abc_Obj_t *pAVar7;
  Mio_Pin_t *pPin;
  Vec_Ptr_t *p;
  void **ppvVar8;
  Hop_Obj_t *pHVar9;
  Hop_Obj_t *pHVar10;
  char *pcVar11;
  int i;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int local_74;
  
  pcVar4 = Io_WriteVerilogGetName(pNtk->pName);
  fprintf((FILE *)pFile,"module %s ( ",pcVar4);
  if ((0 < pNtk->nObjCounts[8]) &&
     (iVar2 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar2 == -1)) {
    fwrite("clock, ",7,1,(FILE *)pFile);
  }
  fwrite("\n   ",4,1,(FILE *)pFile);
  if (0 < pNtk->vPis->nSize) {
    Io_WriteVerilogPis(pFile,pNtk,3);
    fwrite(",\n   ",5,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPos->nSize) {
    Io_WriteVerilogPos(pFile,pNtk,3);
  }
  fwrite("  );\n",5,1,(FILE *)pFile);
  if ((0 < pNtk->nObjCounts[8]) &&
     (iVar2 = Nm_ManFindIdByName(pNtk->pManName,"clock",2), iVar2 == -1)) {
    fwrite("  input  clock;\n",0x10,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPis->nSize) {
    fwrite("  input ",8,1,(FILE *)pFile);
    Io_WriteVerilogPis(pFile,pNtk,10);
    fwrite(";\n",2,1,(FILE *)pFile);
  }
  if (0 < pNtk->vPos->nSize) {
    fwrite("  output",8,1,(FILE *)pFile);
    Io_WriteVerilogPos(pFile,pNtk,5);
    fwrite(";\n",2,1,(FILE *)pFile);
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLACKBOX) {
    if (0 < pNtk->nObjCounts[8]) {
      fwrite("  reg",5,1,(FILE *)pFile);
      iVar2 = pNtk->nObjCounts[8];
      iVar12 = 4;
      iVar16 = 0;
      iVar17 = 0;
      for (iVar13 = 0; iVar13 < pNtk->vBoxes->nSize; iVar13 = iVar13 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar13);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
          pAVar5 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
          pcVar4 = Abc_ObjName(pAVar5);
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          sVar6 = strlen(pcVar4);
          iVar14 = (int)sVar6 + 2;
          if (iVar16 == 0) {
            iVar16 = 0;
          }
          else if (0x4b < iVar14 + iVar12) {
            fwrite("\n   ",4,1,(FILE *)pFile);
            iVar16 = 0;
            iVar12 = 3;
          }
          iVar17 = iVar17 + 1;
          pcVar4 = Abc_ObjName(pAVar5);
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          pcVar11 = ",";
          if (iVar17 == iVar2) {
            pcVar11 = "";
          }
          fprintf((FILE *)pFile," %s%s",pcVar4,pcVar11);
          iVar12 = iVar12 + iVar14;
          iVar16 = iVar16 + 1;
        }
      }
      fwrite(";\n",2,1,(FILE *)pFile);
    }
    iVar2 = Io_WriteVerilogWiresCount(pNtk);
    if (0 < iVar2) {
      iVar2 = 4;
      fwrite("  wire",6,1,(FILE *)pFile);
      iVar12 = Io_WriteVerilogWiresCount(pNtk);
      iVar13 = 0;
      local_74 = 0;
      for (iVar16 = 0; iVar16 < pNtk->vObjs->nSize; iVar16 = iVar16 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar16);
        if ((((pAVar5 != (Abc_Obj_t *)0x0) && (iVar16 != 0)) &&
            ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) &&
           ((pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray],
            (pAVar5->vFanouts).nSize < 1 ||
            ((*(uint *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x14) & 0xf)
             - 5 < 0xfffffffe)))) {
          pcVar4 = Abc_ObjName(pAVar5);
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          sVar6 = strlen(pcVar4);
          iVar17 = (int)sVar6 + 2;
          if (iVar13 == 0) {
LAB_002f0740:
            iVar13 = 0;
          }
          else if (0x4b < iVar17 + iVar2) {
            fwrite("\n   ",4,1,(FILE *)pFile);
            iVar2 = 3;
            goto LAB_002f0740;
          }
          local_74 = local_74 + 1;
          pcVar4 = Abc_ObjName(pAVar5);
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          pcVar11 = ",";
          if (local_74 == iVar12) {
            pcVar11 = "";
          }
          fprintf((FILE *)pFile," %s%s",pcVar4,pcVar11);
          iVar2 = iVar2 + iVar17;
          iVar13 = iVar13 + 1;
        }
      }
      for (iVar16 = 0; iVar17 = pNtk->vBoxes->nSize, iVar16 < iVar17; iVar16 = iVar16 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar16);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          pAVar5 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
          pcVar4 = Abc_ObjName(pAVar5);
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          sVar6 = strlen(pcVar4);
          iVar17 = (int)sVar6 + 2;
          if (iVar13 == 0) {
            iVar13 = 0;
          }
          else if (0x4b < iVar2 + iVar17) {
            fwrite("\n   ",4,1,(FILE *)pFile);
            iVar2 = 3;
            iVar13 = 0;
          }
          local_74 = local_74 + 1;
          pcVar4 = Abc_ObjName(pAVar5);
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          pcVar11 = ",";
          if (local_74 == iVar12) {
            pcVar11 = "";
          }
          fprintf((FILE *)pFile," %s%s",pcVar4,pcVar11);
          iVar2 = iVar2 + iVar17;
          iVar13 = iVar13 + 1;
        }
      }
      for (iVar16 = 0; iVar16 < iVar17; iVar16 = iVar16 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar16);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
          for (lVar15 = 0; lVar15 < (pAVar5->vFanins).nSize; lVar15 = lVar15 + 1) {
            plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar15]];
            pAVar7 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
            pcVar4 = Abc_ObjName(pAVar7);
            pcVar4 = Io_WriteVerilogGetName(pcVar4);
            sVar6 = strlen(pcVar4);
            iVar17 = (int)sVar6 + 2;
            if (iVar13 == 0) {
              iVar13 = 0;
            }
            else if (0x4b < iVar17 + iVar2) {
              fwrite("\n   ",4,1,(FILE *)pFile);
              iVar2 = 3;
              iVar13 = 0;
            }
            pcVar4 = Abc_ObjName(pAVar7);
            pcVar4 = Io_WriteVerilogGetName(pcVar4);
            pcVar11 = ",";
            if (local_74 + (1 - iVar12) + (int)lVar15 == 0) {
              pcVar11 = "";
            }
            fprintf((FILE *)pFile," %s%s",pcVar4,pcVar11);
            iVar2 = iVar2 + iVar17;
            iVar13 = iVar13 + 1;
          }
          local_74 = local_74 + (int)lVar15;
          for (lVar15 = 0; lVar15 < (pAVar5->vFanouts).nSize; lVar15 = lVar15 + 1) {
            plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanouts).pArray[lVar15]];
            pAVar7 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
            if (((pAVar7->vFanouts).nSize < 1) ||
               ((*(uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray] + 0x14) &
                0xf) - 5 < 0xfffffffe)) {
              pcVar4 = Abc_ObjName(pAVar7);
              pcVar4 = Io_WriteVerilogGetName(pcVar4);
              sVar6 = strlen(pcVar4);
              iVar17 = (int)sVar6 + 2;
              if (iVar13 == 0) {
LAB_002f0ace:
                iVar13 = 0;
              }
              else if (0x4b < iVar2 + iVar17) {
                fwrite("\n   ",4,1,(FILE *)pFile);
                iVar2 = 3;
                goto LAB_002f0ace;
              }
              local_74 = local_74 + 1;
              pcVar4 = Abc_ObjName(pAVar7);
              pcVar4 = Io_WriteVerilogGetName(pcVar4);
              pcVar11 = ",";
              if (local_74 == iVar12) {
                pcVar11 = "";
              }
              fprintf((FILE *)pFile," %s%s",pcVar4,pcVar11);
              iVar2 = iVar2 + iVar17;
              iVar13 = iVar13 + 1;
            }
          }
        }
        iVar17 = pNtk->vBoxes->nSize;
      }
      if (local_74 != iVar12) {
        __assert_fail("Counter == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteVerilog.c"
                      ,0x17e,"void Io_WriteVerilogWires(FILE *, Abc_Ntk_t *, int)");
      }
      fwrite(";\n",2,1,(FILE *)pFile);
    }
    iVar2 = pNtk->vBoxes->nSize;
    uVar3 = Abc_Base10Log(iVar2 - pNtk->nObjCounts[8]);
    uVar18 = 0;
    for (iVar12 = 0; iVar12 < iVar2; iVar12 = iVar12 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar12);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
        pNtk_00 = (Abc_Ntk_t *)(pAVar5->field_5).pData;
        fprintf((FILE *)pFile,"  %s box%0*d",pNtk_00->pName,(ulong)uVar3,(ulong)uVar18);
        fputc(0x28,(FILE *)pFile);
        for (lVar15 = 0; lVar15 < pNtk_00->vPis->nSize; lVar15 = lVar15 + 1) {
          pAVar7 = Abc_NtkPi(pNtk_00,(int)lVar15);
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray])
          ;
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          fprintf((FILE *)pFile,".%s",pcVar4);
          plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar15]];
          pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[4] * 8));
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          fprintf((FILE *)pFile,"(%s), ",pcVar4);
        }
        for (uVar19 = 0; (long)uVar19 < (long)pNtk_00->vPos->nSize; uVar19 = uVar19 + 1) {
          pAVar7 = Abc_NtkPo(pNtk_00,(int)uVar19);
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray]);
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          fprintf((FILE *)pFile,".%s",pcVar4);
          plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanouts).pArray[uVar19]];
          pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[6] * 8));
          pcVar11 = Io_WriteVerilogGetName(pcVar4);
          pcVar4 = "    \"%s\", ";
          if (uVar19 == pNtk_00->vPos->nSize - 1) {
            pcVar4 = "T = %d\t\t";
          }
          fprintf((FILE *)pFile,"(%s)%s",pcVar11,pcVar4 + 8);
        }
        uVar18 = uVar18 + 1;
        fwrite(");\n",3,1,(FILE *)pFile);
      }
      iVar2 = pNtk->vBoxes->nSize;
    }
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      uVar3 = Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc);
      iVar12 = Abc_Base10Log(pNtk->nObjCounts[7]);
      iVar2 = 0;
      for (iVar13 = 0; iVar13 < pNtk->vObjs->nSize; iVar13 = iVar13 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar13);
        if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
          pGate = *(Mio_Gate_t **)&(pAVar5->field_5).iData;
          if ((pAVar5->vFanins).nSize == 0) {
            pcVar4 = Mio_GateReadName(pGate);
            iVar16 = strcmp(pcVar4,"_const0_");
            if (iVar16 != 0) {
              pcVar4 = Mio_GateReadName(pGate);
              iVar16 = strcmp(pcVar4,"_const1_");
              if (iVar16 != 0) goto LAB_002f0e36;
            }
            pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
            pcVar4 = Io_WriteVerilogGetName(pcVar4);
            pcVar11 = Mio_GateReadName(pGate);
            iVar16 = strcmp(pcVar11,"_const1_");
            fprintf((FILE *)pFile,"  %-*s %s = 1\'b%d;\n",(ulong)uVar3,"assign",pcVar4,
                    (ulong)(iVar16 == 0));
          }
          else {
LAB_002f0e36:
            pcVar4 = Mio_GateReadName(pGate);
            fprintf((FILE *)pFile,"  %-*s g%0*d",(ulong)uVar3,pcVar4,iVar12,iVar2);
            fputc(0x28,(FILE *)pFile);
            pPin = Mio_GateReadPins(pGate);
            lVar15 = 0;
            while (pPin != (Mio_Pin_t *)0x0) {
              pcVar4 = Mio_PinReadName(pPin);
              pcVar4 = Io_WriteVerilogGetName(pcVar4);
              fprintf((FILE *)pFile,".%s",pcVar4);
              pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                   pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar15]]);
              pcVar4 = Io_WriteVerilogGetName(pcVar4);
              fprintf((FILE *)pFile,"(%s), ",pcVar4);
              pPin = Mio_PinReadNext(pPin);
              lVar15 = lVar15 + 1;
            }
            if ((pAVar5->vFanins).nSize != (int)lVar15) {
              __assert_fail("i == Abc_ObjFaninNum(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteVerilog.c"
                            ,0x227,"void Io_WriteVerilogObjects(FILE *, Abc_Ntk_t *, int)");
            }
            iVar2 = iVar2 + 1;
            pcVar4 = Mio_GateReadOutName(pGate);
            pcVar4 = Io_WriteVerilogGetName(pcVar4);
            fprintf((FILE *)pFile,".%s",pcVar4);
            pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
            pcVar4 = Io_WriteVerilogGetName(pcVar4);
            fprintf((FILE *)pFile,"(%s)",pcVar4);
            fwrite(");\n",3,1,(FILE *)pFile);
          }
        }
      }
    }
    else {
      p = (Vec_Ptr_t *)malloc(0x10);
      p->nCap = 10;
      p->nSize = 0;
      ppvVar8 = (void **)malloc(0x50);
      p->pArray = ppvVar8;
      for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar2);
        if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
          pHVar10 = (Hop_Obj_t *)(pAVar5->field_5).pData;
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray])
          ;
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          fprintf((FILE *)pFile,"  assign %s = ",pcVar4);
          for (lVar15 = 0; lVar15 < (pAVar5->vFanins).nSize; lVar15 = lVar15 + 1) {
            pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar5->pNtk->vObjs->pArray[(pAVar5->vFanins).pArray[lVar15]]);
            pcVar4 = Io_WriteVerilogGetName(pcVar4);
            pcVar4 = Extra_UtilStrsav(pcVar4);
            pHVar9 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,(int)lVar15);
            (pHVar9->field_0).pData = pcVar4;
          }
          Hop_ObjPrintVerilog(pFile,pHVar10,(Vec_Vec_t *)p,0,fOnlyAnds);
          fwrite(";\n",2,1,(FILE *)pFile);
          for (iVar12 = 0; iVar12 < (pAVar5->vFanins).nSize; iVar12 = iVar12 + 1) {
            pHVar10 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar12);
            if ((pHVar10->field_0).pData != (void *)0x0) {
              pHVar10 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar12);
              free((pHVar10->field_0).pData);
              pHVar10 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,iVar12);
              (pHVar10->field_0).pData = (void *)0x0;
            }
          }
        }
      }
      for (lVar15 = 0; lVar15 < p->nSize; lVar15 = lVar15 + 1) {
        if ((Vec_Ptr_t *)p->pArray[lVar15] != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree((Vec_Ptr_t *)p->pArray[lVar15]);
        }
      }
      Vec_PtrFree(p);
    }
    if (0 < pNtk->nObjCounts[8]) {
      fwrite("  always @ (posedge clock) begin\n",0x21,1,(FILE *)pFile);
      for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar2);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
          pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[6] * 8));
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          fprintf((FILE *)pFile,"    %s",pcVar4);
          plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[4] * 8));
          pcVar4 = Io_WriteVerilogGetName(pcVar4);
          fprintf((FILE *)pFile," <= %s;\n",pcVar4);
        }
      }
      fwrite("  end\n",6,1,(FILE *)pFile);
      iVar2 = 0;
      while ((iVar2 < pNtk->vBoxes->nSize &&
             ((pAVar5 = Abc_NtkBox(pNtk,iVar2), (*(uint *)&pAVar5->field_0x14 & 0xf) != 8 ||
              ((iVar12 = Abc_LatchInit(pAVar5), iVar12 != 1 &&
               (iVar12 = Abc_LatchInit(pAVar5), iVar12 != 2))))))) {
        iVar2 = iVar2 + 1;
      }
      if (pNtk->nObjCounts[8] != iVar2) {
        fwrite("  initial begin\n",0x10,1,(FILE *)pFile);
        for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
          pAVar5 = Abc_NtkBox(pNtk,iVar2);
          if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
            iVar12 = Abc_LatchInit(pAVar5);
            pcVar4 = "    %s <= 1\'b0;\n";
            if (iVar12 != 1) {
              iVar12 = Abc_LatchInit(pAVar5);
              pcVar4 = "    %s <= 1\'b1;\n";
              if (iVar12 != 2) goto LAB_002f13e4;
            }
            plVar1 = (long *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
            pcVar11 = Abc_ObjName(*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)plVar1[6] * 8));
            pcVar11 = Io_WriteVerilogGetName(pcVar11);
            fprintf((FILE *)pFile,pcVar4,pcVar11);
          }
LAB_002f13e4:
        }
        fwrite("  end\n",6,1,(FILE *)pFile);
      }
    }
  }
  fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteVerilogInt( FILE * pFile, Abc_Ntk_t * pNtk, int fOnlyAnds )
{
    // write inputs and outputs
//    fprintf( pFile, "module %s ( gclk,\n   ", Abc_NtkName(pNtk) );
    fprintf( pFile, "module %s ( ", Io_WriteVerilogGetName(Abc_NtkName(pNtk)) );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "clock, " );
    // write other primary inputs
    fprintf( pFile, "\n   " );
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
        Io_WriteVerilogPis( pFile, pNtk, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
        Io_WriteVerilogPos( pFile, pNtk, 3 );
    fprintf( pFile, "  );\n" );
    // add the clock signal if it does not exist
    if ( Abc_NtkLatchNum(pNtk) > 0 && Nm_ManFindIdByName(pNtk->pManName, "clock", ABC_OBJ_PI) == -1 )
        fprintf( pFile, "  input  clock;\n" );
    // write inputs, outputs, registers, and wires
    if ( Abc_NtkPiNum(pNtk) > 0  )
    {
//        fprintf( pFile, "  input gclk," );
        fprintf( pFile, "  input " );
        Io_WriteVerilogPis( pFile, pNtk, 10 );
        fprintf( pFile, ";\n" );
    }
    if ( Abc_NtkPoNum(pNtk) > 0  )
    {
        fprintf( pFile, "  output" );
        Io_WriteVerilogPos( pFile, pNtk, 5 );
        fprintf( pFile, ";\n" );
    }
    // if this is not a blackbox, write internal signals
    if ( !Abc_NtkHasBlackbox(pNtk) )
    {
        if ( Abc_NtkLatchNum(pNtk) > 0 )
        {
            fprintf( pFile, "  reg" );
            Io_WriteVerilogRegs( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        if ( Io_WriteVerilogWiresCount(pNtk) > 0 )
        {
            fprintf( pFile, "  wire" );
            Io_WriteVerilogWires( pFile, pNtk, 4 );
            fprintf( pFile, ";\n" );
        }
        // write nodes
        Io_WriteVerilogObjects( pFile, pNtk, fOnlyAnds );        
        // write registers
        if ( Abc_NtkLatchNum(pNtk) > 0 )
            Io_WriteVerilogLatches( pFile, pNtk );
    }
    // finalize the file
    fprintf( pFile, "endmodule\n\n" );
}